

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O1

bool __thiscall SafeQueue<int>::push(SafeQueue<int> *this,int *val)

{
  _Map_pointer ppiVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtx);
  if (iVar4 == 0) {
    ppiVar1 = (this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    piVar2 = (this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    uVar5 = ((long)(this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last -
             (long)(this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur >> 2) +
            ((long)piVar2 -
             (long)(this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 2) +
            ((((ulong)((long)ppiVar1 -
                      (long)(this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppiVar1 == (_Map_pointer)0x0)) * 0x80;
    uVar3 = this->m_maxSize;
    if (uVar5 < uVar3) {
      if (piVar2 == (this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&this->m_queue,val);
      }
      else {
        *piVar2 = *val;
        (this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = piVar2 + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
    return uVar5 < uVar3;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

virtual bool push(const T& val)
    {
        std::lock_guard<std::mutex> lk(m_mtx);

        if (m_queue.size() >= m_maxSize)
            return false;

        m_queue.push(val);
        return true;
    }